

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

RGBA deqp::gles31::Functional::FboTestUtil::getFormatThreshold(TextureFormat *format)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 local_28 [8];
  IVec4 bits;
  TextureFormat *format_local;
  
  bits.m_data._8_8_ = format;
  tcu::getTextureFormatBitDepth((tcu *)local_28,format);
  iVar1 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_28);
  iVar1 = calculateU8ConversionError(iVar1);
  iVar2 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_28);
  iVar2 = calculateU8ConversionError(iVar2);
  iVar3 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_28);
  iVar3 = calculateU8ConversionError(iVar3);
  iVar4 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_28);
  iVar4 = calculateU8ConversionError(iVar4);
  tcu::RGBA::RGBA((RGBA *)((long)&format_local + 4),iVar1,iVar2,iVar3,iVar4);
  return (RGBA)format_local._4_4_;
}

Assistant:

tcu::RGBA getFormatThreshold (const tcu::TextureFormat& format)
{
	const tcu::IVec4 bits = tcu::getTextureFormatBitDepth(format);

	return tcu::RGBA(calculateU8ConversionError(bits.x()),
					 calculateU8ConversionError(bits.y()),
					 calculateU8ConversionError(bits.z()),
					 calculateU8ConversionError(bits.w()));
}